

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_shift.c
# Opt level: O1

int BN_rshift(BIGNUM *r,BIGNUM *a,int n)

{
  ulong *puVar1;
  int iVar2;
  uint uVar3;
  ulong *puVar4;
  int iVar5;
  BIGNUM *pBVar6;
  sbyte sVar7;
  ulong *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  
  if (n < 0) {
    return 0;
  }
  uVar12 = (uint)n >> 6;
  if ((int)uVar12 < a->top) {
    iVar5 = BN_num_bits(a);
    iVar2 = (iVar5 - n) + 0x3f;
    iVar5 = (iVar5 - n) + 0x7e;
    if (-1 < iVar2) {
      iVar5 = iVar2;
    }
    if (r == a) {
      if (n == 0) {
        return 1;
      }
    }
    else {
      r->neg = a->neg;
      pBVar6 = bn_wexpand((BIGNUM *)r,iVar5 >> 6);
      if (pBVar6 == (BIGNUM *)0x0) {
        return 0;
      }
    }
    puVar4 = a->d;
    puVar1 = puVar4 + uVar12;
    puVar8 = r->d;
    uVar3 = a->top;
    r->top = iVar5 >> 6;
    if ((n & 0x3fU) == 0) {
      if (uVar3 != uVar12) {
        lVar9 = 0;
        do {
          puVar8[lVar9] = puVar1[lVar9];
          lVar9 = lVar9 + 1;
        } while (uVar3 - uVar12 != (int)lVar9);
      }
    }
    else {
      uVar10 = *puVar1;
      sVar7 = (sbyte)(n & 0x3fU);
      if (uVar3 - uVar12 != 1) {
        lVar9 = (ulong)uVar12 + 1;
        do {
          uVar11 = uVar10 >> sVar7;
          uVar10 = puVar4[lVar9];
          *puVar8 = uVar10 << (0x40U - sVar7 & 0x3f) | uVar11;
          puVar8 = puVar8 + 1;
          lVar9 = lVar9 + 1;
        } while (uVar3 != (uint)lVar9);
      }
      if (uVar10 >> sVar7 != 0) {
        *puVar8 = uVar10 >> sVar7;
      }
    }
  }
  else {
    BN_zero_ex((BIGNUM *)r);
  }
  return 1;
}

Assistant:

int BN_rshift(BIGNUM *r, const BIGNUM *a, int n)
{
    int i, j, nw, lb, rb;
    BN_ULONG *t, *f;
    BN_ULONG l, tmp;

    bn_check_top(r);
    bn_check_top(a);

    if (n < 0) {
        //BNerr(BN_F_BN_RSHIFT, BN_R_INVALID_SHIFT);
        return 0;
    }

    nw = n / BN_BITS2;
    rb = n % BN_BITS2;
    lb = BN_BITS2 - rb;
    if (nw >= a->top || a->top == 0) {
        BN_zero(r);
        return (1);
    }
    i = (BN_num_bits(a) - n + (BN_BITS2 - 1)) / BN_BITS2;
    if (r != a) {
        r->neg = a->neg;
        if (bn_wexpand(r, i) == NULL)
            return (0);
    } else {
        if (n == 0)
            return 1;           /* or the copying loop will go berserk */
    }

    f = &(a->d[nw]);
    t = r->d;
    j = a->top - nw;
    r->top = i;

    if (rb == 0) {
        for (i = j; i != 0; i--)
            *(t++) = *(f++);
    } else {
        l = *(f++);
        for (i = j - 1; i != 0; i--) {
            tmp = (l >> rb) & BN_MASK2;
            l = *(f++);
            *(t++) = (tmp | (l << lb)) & BN_MASK2;
        }
        if ((l = (l >> rb) & BN_MASK2))
            *(t) = l;
    }
    bn_check_top(r);
    return (1);
}